

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O3

void __thiscall ON_InstanceDefinition::SetURL_Tag(ON_InstanceDefinition *this,wchar_t *url_tag)

{
  undefined8 uVar1;
  bool bVar2;
  ON_wString *this_00;
  ON_wString s;
  ON_wString local_20;
  
  ON_wString::ON_wString(&local_20,url_tag);
  ON_wString::TrimLeftAndRight(&local_20,(wchar_t *)0x0);
  bVar2 = ::operator==(&local_20,&this->m_url_tag);
  if (!bVar2) {
    this_00 = &local_20;
    bVar2 = ON_wString::IsEmpty(this_00);
    if (bVar2) {
      this_00 = &ON_wString::EmptyString;
    }
    ON_wString::operator=(&this->m_url_tag,this_00);
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    *(undefined4 *)((this->m_geometry_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_geometry_content_hash).m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_geometry_content_hash).m_digest + 8) = uVar1;
    uVar1 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar1;
    *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  }
  ON_wString::~ON_wString(&local_20);
  return;
}

Assistant:

void ON_InstanceDefinition::SetURL_Tag( const wchar_t* url_tag )
{
  ON_wString s(url_tag);
  s.TrimLeftAndRight();
  if (s == m_url_tag)
    return;


  if (s.IsEmpty())
    m_url_tag = ON_wString::EmptyString;
  else
    m_url_tag = s;
  Internal_ContentChanged();
}